

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

float __thiscall Json::Value::asFloat(Value *this)

{
  ulong uVar1;
  runtime_error *this_00;
  float fVar2;
  
  switch(this->field_0x8) {
  case 1:
    fVar2 = (float)(this->value_).int_;
    break;
  case 2:
    uVar1 = (this->value_).int_;
    if ((long)uVar1 < 0) {
      fVar2 = (float)uVar1;
    }
    else {
      fVar2 = (float)(long)uVar1;
    }
    break;
  case 3:
    fVar2 = (float)(this->value_).real_;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to float.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    fVar2 = 0.0;
  }
  return fVar2;
}

Assistant:

float Value::asFloat() const {
  switch (type_) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0f : 0.0f;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}